

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMeshControl::~TPZMHMeshControl(TPZMHMeshControl *this)

{
  int64_t iVar1;
  TPZCompEl *pTVar2;
  undefined8 *in_RDI;
  TPZGeoEl *gel;
  TPZCompEl *cel_1;
  int64_t el_1;
  TPZSubCompMesh *subcmesh;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  TPZCompEl *in_stack_ffffffffffffff58;
  TPZCompMesh *in_stack_ffffffffffffff60;
  TPZGeoMesh *in_stack_ffffffffffffff70;
  long local_80;
  long local_30;
  long local_18;
  
  *in_RDI = &PTR__TPZMHMeshControl_025a2ca0;
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  TPZGeoMesh::ResetReference(in_stack_ffffffffffffff70);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
  iVar1 = TPZCompMesh::NElements((TPZCompMesh *)0x1e08df5);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
    pTVar2 = TPZCompMesh::Element(in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58);
    if (pTVar2 != (TPZCompEl *)0x0) {
      if (pTVar2 == (TPZCompEl *)0x0) {
        local_80 = 0;
      }
      else {
        local_80 = __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
      }
      if ((local_80 != 0) && (pTVar2 != (TPZCompEl *)0x0)) {
        (**(code **)(*(long *)pTVar2 + 8))();
      }
    }
  }
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
    pTVar2 = TPZCompMesh::Element(in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58);
    if (((pTVar2 != (TPZCompEl *)0x0) &&
        (in_stack_ffffffffffffff60 = (TPZCompMesh *)TPZCompEl::Reference(pTVar2),
        in_stack_ffffffffffffff60 != (TPZCompMesh *)0x0)) &&
       ((**(code **)(*(long *)pTVar2 + 0x68))(), in_stack_ffffffffffffff58 = pTVar2,
       pTVar2 != (TPZCompEl *)0x0)) {
      (**(code **)(*(long *)pTVar2 + 8))();
      in_stack_ffffffffffffff58 = pTVar2;
    }
  }
  std::
  map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  ::~map((map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
          *)0x1e08fd5);
  std::
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::~map((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
          *)0x1e08fe6);
  std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::~map
            ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             0x1e08ff7);
  TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_ffffffffffffff60);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e09019);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e09027);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer
            ((TPZAutoPointer<TPZCompMesh> *)in_stack_ffffffffffffff60);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer
            ((TPZAutoPointer<TPZCompMesh> *)in_stack_ffffffffffffff60);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer
            ((TPZAutoPointer<TPZCompMesh> *)in_stack_ffffffffffffff60);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer
            ((TPZAutoPointer<TPZCompMesh> *)in_stack_ffffffffffffff60);
  TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer
            ((TPZAutoPointer<TPZGeoMesh> *)in_stack_ffffffffffffff60);
  return;
}

Assistant:

TPZMHMeshControl::~TPZMHMeshControl()
{
    fGMesh->ResetReference();
    int64_t nel = fCMesh->NElements();
    for (int64_t el = 0; el<nel ; el++) {
        TPZCompEl *cel = fCMesh->Element(el);
        if(!cel) continue;
        TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *>(cel);
        if (!subcmesh) {
            continue;
        }
        delete cel;
    }
    for (int64_t el = 0; el<nel ; el++) {
        TPZCompEl *cel = fCMesh->Element(el);
        if(!cel) continue;
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        cel->LoadElementReference();
        delete cel;
    }
}